

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ptags * __thiscall
lest::for_test<lest::ptags>(lest *this,tests *specification,texts *in,ptags *perform,int n)

{
  test *ptVar1;
  int iVar2;
  int iVar3;
  fd_set *__exceptfds;
  int iVar4;
  fd_set *__writefds;
  test *__str;
  undefined4 in_register_00000084;
  string local_90 [32];
  test local_70;
  
  iVar3 = (int)perform;
  iVar4 = 0;
  while( true ) {
    __exceptfds = (fd_set *)
                  (ulong)CONCAT31((int3)((ulong)perform >> 8),iVar4 < iVar3 || iVar3 == -1);
    if (iVar4 >= iVar3 && iVar3 != -1) break;
    ptVar1 = *(test **)(this + 8);
    for (__str = *(test **)this; __str != ptVar1; __str = __str + 1) {
      std::__cxx11::string::string(local_90,&__str->name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      iVar2 = select((int)local_90,(fd_set *)&stack0xffffffffffffff58,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff58);
      std::__cxx11::string::~string(local_90);
      if ((char)iVar2 != '\0') {
        test::test(&local_70,__str);
        ptags::operator()((ptags *)in,&local_70);
        test::~test(&local_70);
      }
    }
    iVar4 = iVar4 + 1;
  }
  return (ptags *)in;
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}